

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O2

Abc_Obj_t * Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode)

{
  Abc_Aig_t *pMan;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p1;
  
  if (((ulong)pNode & 1) == 0) {
    pAVar1 = (Abc_Obj_t *)(pNode->field_6).pTemp;
    if (pAVar1 == (Abc_Obj_t *)0x0) {
      Abc_NtkSensitivityMiter_rec
                (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
      Abc_NtkSensitivityMiter_rec
                (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
      pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
      pAVar1 = Abc_ObjChild0Copy(pNode);
      p1 = Abc_ObjChild1Copy(pNode);
      pAVar1 = Abc_AigAnd(pMan,pAVar1,p1);
      (pNode->field_6).pCopy = pAVar1;
    }
    return pAVar1;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                ,0x30,"Abc_Obj_t *Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Copies the topmost levels of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_NtkSensitivityMiter_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->pCopy )
        return pNode->pCopy;
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin0(pNode) );
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin1(pNode) );
    return pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}